

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# component.h
# Opt level: O2

CSampleHandle __thiscall CSounds::GetSampleId(CSounds *this,int SetId)

{
  CGameClient *pCVar1;
  CDataSoundset *pCVar2;
  int iVar3;
  int iVar4;
  CDataSound *pCVar5;
  
  pCVar1 = (this->super_CComponent).m_pClient;
  iVar4 = -1;
  if (pCVar1->m_pConfig->m_SndEnable != 0) {
    iVar3 = (*(pCVar1->m_pSound->super_IInterface)._vptr_IInterface[2])();
    if (((((char)iVar3 != '\0') && (-1 < SetId)) && (this->m_WaitForSoundJob == false)) &&
       (SetId < g_pData->m_NumSounds)) {
      pCVar2 = g_pData->m_aSounds;
      if (pCVar2[(uint)SetId].m_NumSounds != 0) {
        if (pCVar2[(uint)SetId].m_NumSounds == 1) {
          pCVar5 = pCVar2[(uint)SetId].m_aSounds;
        }
        else {
          do {
            iVar4 = random_int();
            iVar4 = iVar4 % pCVar2[(uint)SetId].m_NumSounds;
          } while (iVar4 == pCVar2[(uint)SetId].m_Last);
          pCVar2[(uint)SetId].m_Last = iVar4;
          pCVar5 = pCVar2[(uint)SetId].m_aSounds + iVar4;
        }
        iVar4 = (pCVar5->m_Id).m_Id;
      }
    }
  }
  return (CSampleHandle)iVar4;
}

Assistant:

class CConfig *Config() const { return m_pClient->Config(); }